

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

positionTy * __thiscall positionTy::operator*=(positionTy *this,double d)

{
  double d_local;
  positionTy *this_local;
  
  this->_lat = d * this->_lat;
  this->_lon = d * this->_lon;
  this->_alt = d * this->_alt;
  this->_ts = d * this->_ts;
  this->_head = d * this->_head;
  this->_pitch = d * this->_pitch;
  this->_roll = d * this->_roll;
  return this;
}

Assistant:

positionTy& positionTy::operator*= (double d)
{
    _lat   *= d;
    _lon   *= d;
    _alt   *= d;
    _ts    *= d;
    _head  *= d;
    _pitch *= d;
    _roll  *= d;
    return *this;
}